

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  long lVar6;
  undefined1 *puVar7;
  void *pvVar8;
  ImGuiSettingsHandler *pIVar9;
  void *pvVar10;
  int iVar11;
  char *pcVar12;
  ImGuiSettingsHandler *handler;
  int iVar13;
  
  pIVar4 = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  iVar11 = (int)ini_size + 1;
  iVar1 = (pIVar4->SettingsIniData).Buf.Capacity;
  if (iVar1 <= (int)ini_size) {
    if (iVar1 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar1 / 2 + iVar1;
    }
    if (iVar13 <= iVar11) {
      iVar13 = iVar11;
    }
    if (iVar1 < iVar13) {
      pcVar5 = (char *)MemAlloc((long)iVar13);
      pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
      if (pcVar2 != (char *)0x0) {
        memcpy(pcVar5,pcVar2,(long)(pIVar4->SettingsIniData).Buf.Size);
        MemFree((pIVar4->SettingsIniData).Buf.Data);
      }
      (pIVar4->SettingsIniData).Buf.Data = pcVar5;
      (pIVar4->SettingsIniData).Buf.Capacity = iVar13;
    }
  }
  (pIVar4->SettingsIniData).Buf.Size = iVar11;
  pcVar2 = (pIVar4->SettingsIniData).Buf.Data;
  memcpy(pcVar2,ini_data,ini_size);
  pcVar2[ini_size] = '\0';
  lVar6 = (long)(pIVar4->SettingsHandlers).Size;
  if (lVar6 != 0) {
    pIVar9 = (pIVar4->SettingsHandlers).Data;
    lVar6 = lVar6 * 0x48;
    do {
      if (pIVar9->ReadInitFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        (*pIVar9->ReadInitFn)(pIVar4,pIVar9);
      }
      pIVar9 = pIVar9 + 1;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != 0);
  }
  if (0 < (long)ini_size) {
    pvVar10 = (void *)0x0;
    pIVar9 = (ImGuiSettingsHandler *)0x0;
    pcVar5 = pcVar2;
    do {
      pcVar12 = pcVar5 + 2;
      for (; (*pcVar5 == '\n' || (pcVar3 = pcVar5, *pcVar5 == '\r')); pcVar5 = pcVar5 + 1) {
        pcVar12 = pcVar12 + 1;
      }
      for (; ((pcVar3 < pcVar2 + ini_size && (*pcVar3 != '\n')) && (*pcVar3 != '\r'));
          pcVar3 = pcVar3 + 1) {
      }
      *pcVar3 = '\0';
      if (*pcVar5 != ';') {
        if (((*pcVar5 == '[') && (pcVar5 < pcVar3)) && (pcVar3[-1] == ']')) {
          pcVar3[-1] = '\0';
          puVar7 = (undefined1 *)memchr(pcVar5 + 1,0x5d,(long)pcVar3 - (long)pcVar12);
          if ((puVar7 != (undefined1 *)0x0) &&
             (pvVar8 = memchr(puVar7 + 1,0x5b,(size_t)(pcVar3 + (-1 - (long)(puVar7 + 1)))),
             pvVar8 != (void *)0x0)) {
            *puVar7 = 0;
            pIVar9 = FindSettingsHandler(pcVar5 + 1);
            if (pIVar9 == (ImGuiSettingsHandler *)0x0) {
              pvVar10 = (void *)0x0;
            }
            else {
              pvVar10 = (*pIVar9->ReadOpenFn)(pIVar4,pIVar9,(char *)((long)pvVar8 + 1));
            }
          }
        }
        else if ((pIVar9 != (ImGuiSettingsHandler *)0x0) && (pvVar10 != (void *)0x0)) {
          (*pIVar9->ReadLineFn)(pIVar4,pIVar9,pvVar10,pcVar5);
        }
      }
      pcVar5 = pcVar3 + 1;
    } while (pcVar5 < pcVar2 + ini_size);
  }
  pIVar4->SettingsLoaded = true;
  memcpy(pcVar2,ini_data,ini_size);
  lVar6 = (long)(pIVar4->SettingsHandlers).Size;
  if (lVar6 != 0) {
    pIVar9 = (pIVar4->SettingsHandlers).Data;
    lVar6 = lVar6 * 0x48;
    do {
      if (pIVar9->ApplyAllFn != (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0) {
        (*pIVar9->ApplyAllFn)(pIVar4,pIVar9);
      }
      pIVar9 = pIVar9 + 1;
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ReadInitFn != NULL)
            handler.ReadInitFn(&g, &handler);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (ImGuiSettingsHandler& handler : g.SettingsHandlers)
        if (handler.ApplyAllFn != NULL)
            handler.ApplyAllFn(&g, &handler);
}